

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  sqlite3 *db;
  int iVar4;
  size_t sVar5;
  u8 uVar6;
  int iVar7;
  u16 uVar8;
  uint uVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  
  if (z == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    return 0;
  }
  db = pMem->db;
  if (db == (sqlite3 *)0x0) {
    iVar7 = 1000000000;
  }
  else {
    iVar7 = db->aLimit[0];
  }
  uVar9 = 2;
  if (enc == '\0') {
    uVar9 = 0x10;
  }
  pcVar10 = z;
  if (n < 0) {
    if (enc == '\x01') {
      sVar5 = strlen(z);
      uVar12 = (ulong)((uint)sVar5 & 0x7fffffff);
    }
    else {
      for (uVar12 = 0;
          ((long)uVar12 <= (long)iVar7 &&
          (pcVar10 = (char *)CONCAT71((int7)((ulong)pcVar10 >> 8),z[uVar12 + 1] | z[uVar12]),
          (byte)(z[uVar12 + 1] | z[uVar12]) != 0)); uVar12 = uVar12 + 2) {
      }
    }
    n = (int)uVar12;
    uVar9 = uVar9 | 0x200;
  }
  uVar8 = (u16)uVar9;
  if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
    iVar4 = 0;
    if (uVar9 >> 9 != 0) {
      iVar4 = (enc != '\x01') + 1;
    }
    if (iVar7 < n) {
      sqlite3ErrorToParser(db,(int)pcVar10);
      return 0x12;
    }
    uVar11 = iVar4 + n;
    uVar9 = 0x20;
    if (0x20 < uVar11) {
      uVar9 = uVar11;
    }
    iVar4 = sqlite3VdbeMemClearAndResize(pMem,uVar9);
    if (iVar4 != 0) {
      return 7;
    }
    memcpy(pMem->z,z,(ulong)uVar11);
  }
  else {
    sqlite3VdbeMemRelease(pMem);
    pMem->z = z;
    if (xDel == sqlite3MallocSize) {
      pMem->zMalloc = z;
      iVar4 = sqlite3DbMallocSize(pMem->db,z);
      pMem->szMalloc = iVar4;
    }
    else {
      pMem->xDel = xDel;
      uVar8 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x400 + uVar8 + 0x400;
    }
  }
  pMem->n = n;
  pMem->flags = uVar8;
  uVar6 = '\x01';
  if (1 < enc) {
    uVar6 = enc;
  }
  pMem->enc = uVar6;
  if ((1 < enc) && (1 < n)) {
    cVar2 = *pMem->z;
    cVar3 = pMem->z[1];
    uVar6 = '\x02';
    if ((cVar3 == -2 && cVar2 == -1) || (uVar6 = '\x03', cVar3 == -1 && cVar2 == -2)) {
      iVar4 = sqlite3VdbeMemMakeWriteable(pMem);
      if (iVar4 != 0) {
        return 7;
      }
      sVar5 = (long)pMem->n - 2;
      pMem->n = (int)sVar5;
      memmove(pMem->z,pMem->z + 2,sVar5);
      pMem->z[pMem->n] = '\0';
      pMem->z[(long)pMem->n + 1] = '\0';
      pbVar1 = (byte *)((long)&pMem->flags + 1);
      *pbVar1 = *pbVar1 | 2;
      pMem->enc = uVar6;
    }
  }
  iVar4 = 0x12;
  if (n <= iVar7) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = 0x7fffffff & (int)strlen(z);
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    u32 nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return sqlite3ErrorToParser(pMem->db, SQLITE_TOOBIG);
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, (int)MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    if( xDel==SQLITE_DYNAMIC ){
      pMem->zMalloc = pMem->z;
      pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
    }else{
      pMem->xDel = xDel;
      flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
    }
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}